

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O0

int __thiscall sqlite::Connection::Stmt::bind(Stmt *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  undefined4 uVar1;
  int iVar2;
  Logic_error *this_00;
  sqlite3 *db;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *pcVar3;
  int status;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  sqlite3_stmt *sql;
  undefined4 in_stack_ffffffffffffff18;
  allocator local_d1;
  string local_d0 [12];
  int in_stack_ffffffffffffff3c;
  
  sql = this->stmt_;
  this_00 = (Logic_error *)std::__cxx11::string::c_str();
  uVar1 = std::__cxx11::string::length();
  iVar2 = sqlite3_bind_text(sql,__fd,this_00,uVar1,0xffffffffffffffff);
  if (iVar2 != 0) {
    db = (sqlite3 *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(in_stack_ffffffffffffff3c);
    std::operator+((char *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    std::operator+(in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            sqlite3_errmsg(this->db_);
    std::operator+(__lhs,(char *)in_stack_fffffffffffffef0);
    pcVar3 = (char *)sqlite3_sql(this->stmt_);
    iVar2 = (int)((ulong)this >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,pcVar3,&local_d1);
    Logic_error::Logic_error
              (this_00,(string *)CONCAT44(__fd,in_stack_ffffffffffffff18),(string *)sql,iVar2,db);
    __cxa_throw(db,&Logic_error::typeinfo,Logic_error::~Logic_error);
  }
  return iVar2;
}

Assistant:

void Connection::Stmt::bind(const int index, const std::string & val)
    {
        int status = sqlite3_bind_text(stmt_, index, val.c_str(), val.length(), SQLITE_TRANSIENT);
        if(status != SQLITE_OK)
        {
            throw Logic_error("Error binding index " +
                std::to_string(index) + ": " + sqlite3_errmsg(db_), sqlite3_sql(stmt_), status, db_);
        }
    }